

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O2

bool __thiscall bssl::der::ParseVisibleString(der *this,Input in,string *out)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  puVar3 = in.data_.data_;
  puVar1 = (uchar *)0x0;
  do {
    puVar2 = puVar1;
    if (puVar3 == puVar2) {
      local_20._M_len = (size_t)puVar3;
      local_20._M_str = (char *)this;
      ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)in.data_.size_,&local_20);
      break;
    }
    puVar1 = puVar2 + 1;
  } while ((byte)((char)this[(long)puVar2] - 0x20U) < 0x5f);
  return puVar3 == puVar2;
}

Assistant:

bool ParseVisibleString(Input in, std::string *out) {
  // ITU-T X.680:
  // VisibleString : "Defining registration number 6" + SPACE
  // 6 includes all the characters from '!' .. '~' (33 .. 126), space is 32.
  // Also ITU-T X.691 says it much more clearly:
  // "for VisibleString [the range] is 32 to 126 ... For VisibleString .. all
  // the values in the range are present."
  for (uint8_t c : in) {
    if (c < 32 || c > 126) {
      return false;
    }
  }
  *out = BytesAsStringView(in);
  return true;
}